

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O2

void __thiscall rlottie::internal::model::Ellipse::Ellipse(Ellipse *this)

{
  (this->super_Shape).super_Object.field_0.mPtr = (char *)0x0;
  (this->super_Shape).super_Object.field_0.mData._type = Ellipse;
  *(byte *)((long)&(this->super_Shape).super_Object.field_0 + 0xf) =
       *(byte *)((long)&(this->super_Shape).super_Object.field_0 + 0xf) & 0xf8 | 5;
  (this->super_Shape).mDirection = 1;
  (this->mPos).isValue_ = true;
  (this->mPos).impl_ = (details)0x0;
  (this->mSize).isValue_ = true;
  (this->mSize).impl_ = (details)0x0;
  return;
}

Assistant:

explicit Object(Object::Type type) : mPtr(nullptr)
    {
        mData._type = type;
        mData._static = true;
        mData._shortString = true;
        mData._hidden = false;
    }